

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::PrettyUnitTestResultPrinter::PrintFailedTests(UnitTest *unit_test)

{
  pointer piVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  pointer ppTVar5;
  pointer ppTVar6;
  UnitTestImpl *pUVar7;
  uint uVar8;
  char *pcVar9;
  long lVar10;
  TestInfo *test_info;
  char *in_R8;
  TestSuite *this;
  long lVar11;
  string local_50;
  
  uVar3 = UnitTestImpl::failed_test_count(unit_test->impl_);
  ColoredPrintf(kRed,"[  FAILED  ] ");
  FormatCountableNoun_abi_cxx11_(&local_50,(testing *)(ulong)uVar3,0x2102b0,"tests",in_R8);
  printf("%s, listed below:\n",local_50._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pUVar7 = unit_test->impl_;
  ppTVar5 = (pUVar7->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pUVar7->test_suites_).
                              super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5) >> 3)) {
    lVar10 = 0;
    do {
      piVar1 = (pUVar7->test_suite_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((lVar10 < (int)((ulong)((long)(pUVar7->test_suite_indices_).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)piVar1) >> 2)) &&
         (-1 < piVar1[lVar10])) {
        this = ppTVar5[lVar10];
      }
      else {
        this = (TestSuite *)0x0;
      }
      if (this->should_run_ == true) {
        iVar4 = TestSuite::failed_test_count(this);
        if ((iVar4 != 0) &&
           (ppTVar6 = (this->test_info_list_).
                      super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
           0 < (int)((ulong)((long)(this->test_info_list_).
                                   super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar6) >> 3)
           )) {
          lVar11 = 0;
          do {
            piVar1 = (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar8 = 0xffffffff;
            if (lVar11 < (int)((ulong)((long)(this->test_indices_).
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_finish - (long)piVar1) >> 2)
               ) {
              uVar8 = piVar1[lVar11];
            }
            if ((int)uVar8 < 0) {
              test_info = (TestInfo *)0x0;
            }
            else {
              test_info = ppTVar6[uVar8];
            }
            if (test_info->should_run_ == true) {
              bVar2 = TestResult::Failed(&test_info->result_);
              if (bVar2) {
                ColoredPrintf(kRed,"[  FAILED  ] ");
                printf("%s.%s",(this->name_)._M_dataplus._M_p,(test_info->name_)._M_dataplus._M_p);
                PrintFullTestCommentIfPresent(test_info);
                putchar(10);
              }
            }
            lVar11 = lVar11 + 1;
            ppTVar6 = (this->test_info_list_).
                      super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          } while (lVar11 < (int)((ulong)((long)(this->test_info_list_).
                                                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)ppTVar6) >> 3));
        }
      }
      lVar10 = lVar10 + 1;
      pUVar7 = unit_test->impl_;
      ppTVar5 = (pUVar7->test_suites_).
                super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (lVar10 < (int)((ulong)((long)(pUVar7->test_suites_).
                                          super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5
                                   ) >> 3));
  }
  pcVar9 = "TESTS";
  if (uVar3 == 1) {
    pcVar9 = "TEST";
  }
  printf("\n%2d FAILED %s\n",(ulong)uVar3,pcVar9);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::PrintFailedTests(const UnitTest& unit_test) {
  const int failed_test_count = unit_test.failed_test_count();
  ColoredPrintf(GTestColor::kRed, "[  FAILED  ] ");
  printf("%s, listed below:\n", FormatTestCount(failed_test_count).c_str());

  for (int i = 0; i < unit_test.total_test_suite_count(); ++i) {
    const TestSuite& test_suite = *unit_test.GetTestSuite(i);
    if (!test_suite.should_run() || (test_suite.failed_test_count() == 0)) {
      continue;
    }
    for (int j = 0; j < test_suite.total_test_count(); ++j) {
      const TestInfo& test_info = *test_suite.GetTestInfo(j);
      if (!test_info.should_run() || !test_info.result()->Failed()) {
        continue;
      }
      ColoredPrintf(GTestColor::kRed, "[  FAILED  ] ");
      printf("%s.%s", test_suite.name(), test_info.name());
      PrintFullTestCommentIfPresent(test_info);
      printf("\n");
    }
  }
  printf("\n%2d FAILED %s\n", failed_test_count,
         failed_test_count == 1 ? "TEST" : "TESTS");
}